

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

bool ImGui::BeginPopupModal(char *name,bool *p_open,ImGuiWindowFlags flags)

{
  ImVec2 IVar1;
  ImVec2 IVar2;
  int iVar3;
  ImGuiViewportP *pIVar4;
  ImGuiContext *pIVar5;
  ImGuiContext *pIVar6;
  bool bVar7;
  ImGuiID IVar8;
  ImGuiContext *g;
  ImVec2 IVar9;
  
  pIVar5 = GImGui;
  IVar8 = ImGuiWindow::GetID(GImGui->CurrentWindow,name,(char *)0x0);
  pIVar6 = GImGui;
  iVar3 = (GImGui->BeginPopupStack).Size;
  if ((iVar3 < (GImGui->OpenPopupStack).Size) &&
     ((GImGui->OpenPopupStack).Data[iVar3].PopupId == IVar8)) {
    if (((pIVar5->NextWindowData).Flags & 1) == 0) {
      pIVar4 = *(GImGui->Viewports).Data;
      IVar1 = (pIVar4->super_ImGuiViewport).Pos;
      IVar2 = (pIVar4->super_ImGuiViewport).Size;
      IVar9.x = IVar2.x * 0.5 + IVar1.x;
      IVar9.y = IVar2.y * 0.5 + IVar1.y;
      (GImGui->NextWindowData).Flags = (GImGui->NextWindowData).Flags | 1;
      (pIVar6->NextWindowData).PosVal = IVar9;
      (pIVar6->NextWindowData).PosPivotVal.x = 0.5;
      (pIVar6->NextWindowData).PosPivotVal.y = 0.5;
      (pIVar6->NextWindowData).PosCond = 4;
    }
    bVar7 = Begin(name,p_open,flags | 0xc000020);
    if (bVar7) {
      if (p_open == (bool *)0x0) {
        return true;
      }
      if (*p_open != false) {
        return true;
      }
      EndPopup();
      if (bVar7) {
        ClosePopupToLevel((pIVar5->BeginPopupStack).Size,true);
      }
    }
    else {
      EndPopup();
    }
  }
  else {
    (pIVar5->NextWindowData).Flags = 0;
  }
  return false;
}

Assistant:

bool ImGui::BeginPopupModal(const char* name, bool* p_open, ImGuiWindowFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    const ImGuiID id = window->GetID(name);
    if (!IsPopupOpen(id, ImGuiPopupFlags_None))
    {
        g.NextWindowData.ClearFlags(); // We behave like Begin() and need to consume those values
        return false;
    }

    // Center modal windows by default for increased visibility
    // (this won't really last as settings will kick in, and is mostly for backward compatibility. user may do the same themselves)
    // FIXME: Should test for (PosCond & window->SetWindowPosAllowFlags) with the upcoming window.
    if ((g.NextWindowData.Flags & ImGuiNextWindowDataFlags_HasPos) == 0)
    {
        const ImGuiViewport* viewport = GetMainViewport();
        SetNextWindowPos(viewport->GetCenter(), ImGuiCond_FirstUseEver, ImVec2(0.5f, 0.5f));
    }

    flags |= ImGuiWindowFlags_Popup | ImGuiWindowFlags_Modal | ImGuiWindowFlags_NoCollapse;
    const bool is_open = Begin(name, p_open, flags);
    if (!is_open || (p_open && !*p_open)) // NB: is_open can be 'false' when the popup is completely clipped (e.g. zero size display)
    {
        EndPopup();
        if (is_open)
            ClosePopupToLevel(g.BeginPopupStack.Size, true);
        return false;
    }
    return is_open;
}